

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

_Bool duckdb_je_prof_thread_active_init_set(tsdn_t *tsdn,_Bool active_init)

{
  _Bool _Var1;
  int iVar2;
  
  iVar2 = pthread_mutex_trylock
                    ((pthread_mutex_t *)((long)&prof_thread_active_init_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&prof_thread_active_init_mtx);
  }
  _Var1 = prof_thread_active_init;
  prof_thread_active_init_mtx.field_0.field_0.prof_data.n_lock_ops =
       prof_thread_active_init_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (prof_thread_active_init_mtx.field_0.field_0.prof_data.prev_owner != tsdn) {
    prof_thread_active_init_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(prof_thread_active_init_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    prof_thread_active_init_mtx.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  prof_thread_active_init_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  prof_thread_active_init = active_init;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&prof_thread_active_init_mtx.field_0 + 0x48));
  return _Var1;
}

Assistant:

bool
prof_thread_active_init_set(tsdn_t *tsdn, bool active_init) {
	bool active_init_old;

	malloc_mutex_lock(tsdn, &prof_thread_active_init_mtx);
	active_init_old = prof_thread_active_init;
	prof_thread_active_init = active_init;
	malloc_mutex_unlock(tsdn, &prof_thread_active_init_mtx);
	return active_init_old;
}